

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O1

CURLcode Curl_proxyCONNECT(connectdata *conn,int sockindex,char *hostname,int remote_port,
                          _Bool blocking)

{
  long *plVar1;
  curl_socket_t sockfd;
  Curl_easy *data;
  bool bVar2;
  _Bool _Var3;
  CURLcode CVar4;
  int iVar5;
  CHUNKcode CVar6;
  Curl_send_buffer *buff;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  time_t tVar10;
  undefined8 extraout_RAX;
  char *pcVar11;
  int iVar12;
  char *pcVar13;
  char *pcVar14;
  ulong uVar15;
  byte bVar16;
  byte bVar17;
  char *pcVar18;
  char cVar19;
  bool bVar20;
  CURLcode local_b0;
  char *local_a8;
  char *local_98;
  size_t local_88;
  long local_80;
  int subversion;
  ulong local_60;
  char *local_58;
  ssize_t gotbytes;
  int *local_48;
  long *local_40;
  ssize_t tookcareof;
  
  subversion = 0;
  if (conn->tunnel_state[sockindex] != TUNNEL_COMPLETE) {
    data = conn->data;
    sockfd = conn->sock[sockindex];
    (conn->bits).proxy_connect_closed = false;
    local_40 = &(data->info).request_size;
    local_48 = &(data->req).httpcode;
    iVar12 = 0;
    local_60 = 0;
    bVar2 = false;
    local_80 = 0;
    local_58 = hostname;
    do {
      pcVar7 = local_58;
      if (conn->tunnel_state[sockindex] == TUNNEL_INIT) {
        Curl_infof(data,"Establish HTTP proxy tunnel to %s:%hu\n",local_58,(ulong)(uint)remote_port)
        ;
        (*Curl_cfree)((data->req).newurl);
        (data->req).newurl = (char *)0x0;
        buff = Curl_add_buffer_init();
        if (buff == (Curl_send_buffer *)0x0) {
LAB_0013b366:
          bVar20 = false;
          local_b0 = CURLE_OUT_OF_MEMORY;
        }
        else {
          pcVar7 = curl_maprintf("%s:%hu",pcVar7,(ulong)(uint)remote_port);
          if (pcVar7 == (char *)0x0) {
            Curl_add_buffer_free(buff);
            goto LAB_0013b366;
          }
          CVar4 = Curl_http_output_auth(conn,"CONNECT",pcVar7,true);
          (*Curl_cfree)(pcVar7);
          pcVar7 = local_58;
          if (CVar4 == CURLE_OK) {
            pcVar14 = "1.1";
            if ((conn->http_proxy).proxytype == CURLPROXY_HTTP_1_0) {
              pcVar14 = "1.0";
            }
            if ((conn->host).name == local_58) {
              cVar19 = (conn->bits).ipv6_ip;
            }
            else {
              pcVar8 = strchr(local_58,0x3a);
              cVar19 = pcVar8 != (char *)0x0;
            }
            pcVar8 = "";
            if (cVar19 != '\0') {
              pcVar8 = "[";
            }
            pcVar11 = "";
            if (cVar19 != '\0') {
              pcVar11 = "]";
            }
            pcVar7 = curl_maprintf("%s%s%s:%hu",pcVar8,pcVar7,pcVar11,(ulong)(uint)remote_port);
            if (pcVar7 == (char *)0x0) {
              Curl_add_buffer_free(buff);
LAB_0013b42d:
              local_b0 = CURLE_OUT_OF_MEMORY;
              CVar4 = CURLE_OK;
              bVar20 = false;
            }
            else {
              pcVar8 = Curl_checkProxyheaders(conn,"Host:");
              if (pcVar8 == (char *)0x0) {
                pcVar8 = curl_maprintf("Host: %s\r\n");
                if (pcVar8 == (char *)0x0) {
                  (*Curl_cfree)(pcVar7);
                  Curl_add_buffer_free(buff);
                  goto LAB_0013b42d;
                }
              }
              else {
                pcVar8 = (char *)0x0;
              }
              pcVar11 = Curl_checkProxyheaders(conn,"Proxy-Connection:");
              pcVar18 = "";
              if (pcVar11 == (char *)0x0) {
                pcVar18 = "Proxy-Connection: Keep-Alive\r\n";
              }
              pcVar9 = Curl_checkProxyheaders(conn,"User-Agent:");
              pcVar11 = "";
              if ((pcVar9 == (char *)0x0) && (pcVar11 = "", (data->set).str[0x24] != (char *)0x0)) {
                pcVar11 = (conn->allocptr).uagent;
              }
              pcVar9 = pcVar8;
              if (pcVar8 == (char *)0x0) {
                pcVar9 = "";
              }
              pcVar13 = (conn->allocptr).proxyuserpwd;
              if (pcVar13 == (char *)0x0) {
                pcVar13 = "";
              }
              CVar4 = Curl_add_bufferf(buff,"CONNECT %s HTTP/%s\r\n%s%s%s%s",pcVar7,pcVar14,pcVar9,
                                       pcVar13,pcVar11,pcVar18);
              if (pcVar8 != (char *)0x0) {
                (*Curl_cfree)(pcVar8);
              }
              (*Curl_cfree)(pcVar7);
              if (CVar4 == CURLE_OK) {
                CVar4 = Curl_add_custom_headers(conn,true,buff);
              }
              if (CVar4 == CURLE_OK) {
                CVar4 = Curl_add_bufferf(buff,"\r\n");
              }
              if (CVar4 == CURLE_OK) {
                CVar4 = Curl_add_buffer_send(buff,conn,local_40,0,sockindex);
              }
              bVar20 = true;
              if (CVar4 != CURLE_OK) {
                Curl_failf(data,"Failed sending CONNECT to proxy");
              }
              buff = (Curl_send_buffer *)0x0;
            }
            if (bVar20) goto LAB_0013b578;
            bVar20 = false;
          }
          else {
LAB_0013b578:
            Curl_add_buffer_free(buff);
            if (CVar4 == CURLE_OK) {
              conn->tunnel_state[sockindex] = TUNNEL_CONNECT;
              bVar20 = true;
            }
            else {
              bVar20 = false;
              local_b0 = CVar4;
            }
          }
        }
        if (!bVar20) {
          return local_b0;
        }
      }
      tVar10 = Curl_timeleft(data,(timeval *)0x0,true);
      if (tVar10 < 1) {
        Curl_failf(data,"Proxy CONNECT aborted due to timeout");
        return CURLE_RECV_ERROR;
      }
      if ((!blocking) && (_Var3 = Curl_conn_data_pending(conn,sockindex), !_Var3)) {
        return CURLE_OK;
      }
      if (iVar12 == 0) {
        local_a8 = (data->state).buffer;
        local_88 = 0;
        bVar16 = 1;
        uVar15 = 0;
        local_98 = local_a8;
        do {
          iVar5 = Curl_pgrsUpdate(conn);
          if (iVar5 == 0) {
            if (local_a8 < (data->state).buffer + 0x4000) {
              tVar10 = Curl_timeleft(data,(timeval *)0x0,true);
              if (tVar10 < 1) {
                Curl_failf(data,"Proxy CONNECT aborted due to timeout");
                iVar12 = 2;
                bVar17 = 7;
              }
              else {
                CVar4 = Curl_read(conn,sockfd,local_a8,1,&gotbytes);
                bVar17 = 7;
                if (CVar4 == CURLE_OK) {
                  if (gotbytes < 1) {
                    if (((data->set).proxyauth == 0) || ((data->state).authproxy.avail == 0)) {
                      bVar16 = 0;
                      pcVar7 = "Proxy CONNECT aborted";
                      goto LAB_0013b894;
                    }
                    (conn->bits).proxy_connect_closed = true;
                    bVar16 = 0;
                    Curl_infof(data,"Proxy CONNECT connection closed\n");
                  }
                  else if (bVar16 < 2) {
                    uVar15 = uVar15 + 1;
                    local_88 = (long)(int)local_88 + 1;
                    if (*local_a8 == '\n') {
                      if ((data->set).verbose == true) {
                        Curl_debug(data,CURLINFO_HEADER_IN,local_98,(long)(int)local_88,conn);
                      }
                      CVar4 = Curl_client_write(conn,(data->set).include_header | 2,local_98,
                                                local_88);
                      plVar1 = &(data->info).header_size;
                      *plVar1 = *plVar1 + local_88;
                      plVar1 = &(data->req).headerbytecount;
                      *plVar1 = *plVar1 + local_88;
                      bVar16 = 1;
                      if (CVar4 == CURLE_OK) {
                        if ((*local_98 == '\r') || (*local_98 == '\n')) {
                          local_a8 = (data->state).buffer;
                          bVar16 = 0;
                          if (((data->req).httpcode == 0x197) &&
                             ((data->state).authproblem == false)) {
                            if (local_80 == 0) {
                              if ((local_60 & 1) != 0) {
                                Curl_infof(data,"Ignore chunked response-body\n");
                                (data->req).ignorebody = true;
                                if (local_98[1] == '\n') {
                                  local_98 = local_98 + 1;
                                }
                                CVar6 = Curl_httpchunk_read(conn,local_98 + 1,1,&gotbytes);
                                bVar16 = 2;
                                if (CVar6 == CHUNKE_STOP) {
                                  bVar16 = 0;
                                  Curl_infof(data,"chunk reading DONE\n");
                                  conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
                                }
                              }
                            }
                            else {
                              Curl_infof(data,"Ignore %lld bytes of response-body\n");
                              bVar16 = 2;
                            }
                          }
                          conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
                          bVar17 = 6;
                          uVar15 = 0;
                        }
                        else {
                          local_98[local_88] = '\0';
                          iVar5 = curl_strnequal("WWW-Authenticate:",local_98,0x11);
                          if (((iVar5 == 0) || ((data->req).httpcode != 0x191)) &&
                             ((iVar5 = curl_strnequal("Proxy-authenticate:",local_98,0x13),
                              iVar5 == 0 || ((data->req).httpcode != 0x197)))) {
                            iVar5 = curl_strnequal("Content-Length:",local_98,0xf);
                            if (iVar5 == 0) {
                              _Var3 = Curl_compareheader(local_98,"Connection:","close");
                              if (_Var3) {
LAB_0013bb4b:
                                bVar2 = true;
                              }
                              else {
                                _Var3 = Curl_compareheader(local_98,"Transfer-Encoding:","chunked");
                                if (_Var3) {
                                  if ((data->req).httpcode - 200U < 100) {
                                    pcVar7 = "Transfer-Encoding: in %03d response";
                                    goto LAB_0013ba72;
                                  }
                                  Curl_infof(data,"CONNECT responded chunked\n");
                                  Curl_httpchunk_init(conn);
                                  local_60 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                                }
                                else {
                                  _Var3 = Curl_compareheader(local_98,"Proxy-Connection:","close");
                                  if (_Var3) goto LAB_0013bb4b;
                                  iVar5 = __isoc99_sscanf(local_98,"HTTP/1.%d %d",&subversion,
                                                          local_48);
                                  if (iVar5 == 2) {
                                    (data->info).httpproxycode = (data->req).httpcode;
                                  }
                                }
                              }
                            }
                            else {
                              if ((data->req).httpcode - 200U < 100) {
                                pcVar7 = "Content-Length: in %03d response";
LAB_0013ba72:
                                Curl_failf(data,pcVar7);
                                goto LAB_0013b701;
                              }
                              local_80 = strtol(local_98 + 0xf,(char **)0x0,10);
                            }
                          }
                          else {
                            iVar5 = (data->req).httpcode;
                            pcVar7 = Curl_copy_header_value(local_98);
                            if (pcVar7 == (char *)0x0) {
                              bVar20 = false;
                              local_b0 = CURLE_OUT_OF_MEMORY;
                            }
                            else {
                              CVar4 = Curl_http_input_auth(conn,iVar5 == 0x197,pcVar7);
                              (*Curl_cfree)(pcVar7);
                              bVar20 = CVar4 == CURLE_OK;
                              if (!bVar20) {
                                local_b0 = CVar4;
                              }
                            }
                            if (!bVar20) goto LAB_0013b709;
                          }
                          local_a8 = (data->state).buffer;
                          bVar17 = 0;
                          local_88 = 0;
                          local_98 = local_a8;
                        }
                      }
                      else {
                        bVar17 = 1;
                        local_b0 = CVar4;
                      }
                    }
                    else {
                      local_a8 = local_a8 + 1;
                      bVar16 = 1;
                      bVar17 = 6;
                    }
                  }
                  else {
                    local_a8 = (data->state).buffer;
                    if (local_80 == 0) {
                      tookcareof = 0;
                      CVar6 = Curl_httpchunk_read(conn,local_a8,1,&tookcareof);
                      bVar16 = 2;
                      if (CVar6 == CHUNKE_STOP) {
                        bVar16 = 0;
                        Curl_infof(data,"chunk reading DONE\n");
                        conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
                      }
                      bVar17 = 6;
                      uVar15 = 0;
                      local_80 = 0;
                    }
                    else {
                      bVar17 = local_80 < 2 | 6;
                      bVar16 = (1 < local_80) * '\x02';
                      uVar15 = 0;
                      local_80 = local_80 + -1;
                    }
                  }
                }
                else if (CVar4 == CURLE_AGAIN) {
                  if (999 < tVar10) {
                    tVar10 = 1000;
                  }
                  iVar5 = Curl_socket_check(sockfd,-1,-1,tVar10);
                  if (iVar5 == -1) {
                    pcVar7 = "Proxy CONNECT aborted due to select/poll error";
LAB_0013b894:
                    Curl_failf(data,pcVar7);
                    iVar12 = 1;
                  }
                  else {
                    bVar17 = 6;
                  }
                }
                else {
                  bVar16 = 0;
                }
              }
            }
            else {
              Curl_failf(data,"CONNECT response too large!");
LAB_0013b701:
              local_b0 = CURLE_RECV_ERROR;
LAB_0013b709:
              bVar17 = 1;
            }
          }
          else {
            bVar17 = 1;
            local_b0 = CURLE_ABORTED_BY_CALLBACK;
          }
          if ((bVar17 != 0) && (bVar17 != 6)) {
            if (bVar17 != 7) goto LAB_0013bd05;
            break;
          }
          if (((0x3fff < uVar15) || (bVar16 == 0)) || (iVar12 != 0)) break;
        } while( true );
      }
      iVar5 = Curl_pgrsUpdate(conn);
      bVar17 = 1;
      if (iVar5 == 0) {
        if (iVar12 == 0) {
          if ((data->info).httpproxycode != 200) {
            CVar4 = Curl_http_auth_act(conn);
            if (CVar4 != CURLE_OK) {
              iVar12 = 0;
              local_b0 = CVar4;
              goto LAB_0013bd05;
            }
            if ((conn->bits).close != false) {
              bVar2 = true;
            }
          }
          iVar12 = 0;
          if ((bVar2) && ((data->req).newurl != (char *)0x0)) {
            Curl_closesocket(conn,conn->sock[sockindex]);
            conn->sock[sockindex] = -1;
            bVar17 = 2;
            iVar12 = 0;
          }
          else {
            bVar17 = 0;
          }
        }
        else {
          local_b0 = CURLE_RECV_ERROR;
        }
      }
      else {
        local_b0 = CURLE_ABORTED_BY_CALLBACK;
      }
LAB_0013bd05:
      if (bVar17 != 0) {
        if (bVar17 != 2) {
          return local_b0;
        }
        break;
      }
      if (((data->req).newurl != (char *)0x0) && (conn->tunnel_state[sockindex] == TUNNEL_COMPLETE))
      {
        conn->tunnel_state[sockindex] = TUNNEL_INIT;
        Curl_infof(data,"TUNNEL_STATE switched to: %d\n",0);
      }
    } while ((data->req).newurl != (char *)0x0);
    if ((data->req).httpcode == 200) {
      conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
      (*Curl_cfree)((conn->allocptr).proxyuserpwd);
      (conn->allocptr).proxyuserpwd = (char *)0x0;
      (data->state).authproxy.done = true;
      Curl_infof(data,"Proxy replied OK to CONNECT request\n");
      (data->req).ignorebody = false;
      (conn->bits).rewindaftersend = false;
      return CURLE_OK;
    }
    if ((bVar2) && ((data->req).newurl != (char *)0x0)) {
      (conn->bits).proxy_connect_closed = true;
      Curl_infof(data,"Connect me again please\n");
    }
    else {
      (*Curl_cfree)((data->req).newurl);
      (data->req).newurl = (char *)0x0;
      Curl_conncontrol(conn,2);
      Curl_closesocket(conn,conn->sock[sockindex]);
      conn->sock[sockindex] = -1;
    }
    conn->tunnel_state[sockindex] = TUNNEL_INIT;
    if ((conn->bits).proxy_connect_closed == false) {
      Curl_failf(data,"Received HTTP code %d from proxy after CONNECT",
                 (ulong)(uint)(data->req).httpcode);
      return CURLE_RECV_ERROR;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_proxyCONNECT(struct connectdata *conn,
                           int sockindex,
                           const char *hostname,
                           int remote_port,
                           bool blocking)
{
  int subversion=0;
  struct Curl_easy *data=conn->data;
  struct SingleRequest *k = &data->req;
  CURLcode result;
  curl_socket_t tunnelsocket = conn->sock[sockindex];
  curl_off_t cl=0;
  bool closeConnection = FALSE;
  bool chunked_encoding = FALSE;
  time_t check;

#define SELECT_OK      0
#define SELECT_ERROR   1
#define SELECT_TIMEOUT 2
  int error = SELECT_OK;

  if(conn->tunnel_state[sockindex] == TUNNEL_COMPLETE)
    return CURLE_OK; /* CONNECT is already completed */

  conn->bits.proxy_connect_closed = FALSE;

  do {
    if(TUNNEL_INIT == conn->tunnel_state[sockindex]) {
      /* BEGIN CONNECT PHASE */
      char *host_port;
      Curl_send_buffer *req_buffer;

      infof(data, "Establish HTTP proxy tunnel to %s:%hu\n",
            hostname, remote_port);

        /* This only happens if we've looped here due to authentication
           reasons, and we don't really use the newly cloned URL here
           then. Just free() it. */
      free(data->req.newurl);
      data->req.newurl = NULL;

      /* initialize a dynamic send-buffer */
      req_buffer = Curl_add_buffer_init();

      if(!req_buffer)
        return CURLE_OUT_OF_MEMORY;

      host_port = aprintf("%s:%hu", hostname, remote_port);
      if(!host_port) {
        Curl_add_buffer_free(req_buffer);
        return CURLE_OUT_OF_MEMORY;
      }

      /* Setup the proxy-authorization header, if any */
      result = Curl_http_output_auth(conn, "CONNECT", host_port, TRUE);

      free(host_port);

      if(!result) {
        char *host = NULL;
        const char *proxyconn="";
        const char *useragent="";
        const char *http = (conn->http_proxy.proxytype == CURLPROXY_HTTP_1_0) ?
          "1.0" : "1.1";
        bool ipv6_ip = conn->bits.ipv6_ip;
        char *hostheader;

        /* the hostname may be different */
        if(hostname != conn->host.name)
          ipv6_ip = (strchr(hostname, ':') != NULL);
        hostheader= /* host:port with IPv6 support */
          aprintf("%s%s%s:%hu", ipv6_ip?"[":"", hostname, ipv6_ip?"]":"",
                  remote_port);
        if(!hostheader) {
          Curl_add_buffer_free(req_buffer);
          return CURLE_OUT_OF_MEMORY;
        }

        if(!Curl_checkProxyheaders(conn, "Host:")) {
          host = aprintf("Host: %s\r\n", hostheader);
          if(!host) {
            free(hostheader);
            Curl_add_buffer_free(req_buffer);
            return CURLE_OUT_OF_MEMORY;
          }
        }
        if(!Curl_checkProxyheaders(conn, "Proxy-Connection:"))
          proxyconn = "Proxy-Connection: Keep-Alive\r\n";

        if(!Curl_checkProxyheaders(conn, "User-Agent:") &&
           data->set.str[STRING_USERAGENT])
          useragent = conn->allocptr.uagent;

        result =
          Curl_add_bufferf(req_buffer,
                           "CONNECT %s HTTP/%s\r\n"
                           "%s"  /* Host: */
                           "%s"  /* Proxy-Authorization */
                           "%s"  /* User-Agent */
                           "%s", /* Proxy-Connection */
                           hostheader,
                           http,
                           host?host:"",
                           conn->allocptr.proxyuserpwd?
                           conn->allocptr.proxyuserpwd:"",
                           useragent,
                           proxyconn);

        if(host)
          free(host);
        free(hostheader);

        if(!result)
          result = Curl_add_custom_headers(conn, TRUE, req_buffer);

        if(!result)
          /* CRLF terminate the request */
          result = Curl_add_bufferf(req_buffer, "\r\n");

        if(!result) {
          /* Send the connect request to the proxy */
          /* BLOCKING */
          result =
            Curl_add_buffer_send(req_buffer, conn,
                                 &data->info.request_size, 0, sockindex);
        }
        req_buffer = NULL;
        if(result)
          failf(data, "Failed sending CONNECT to proxy");
      }

      Curl_add_buffer_free(req_buffer);
      if(result)
        return result;

      conn->tunnel_state[sockindex] = TUNNEL_CONNECT;
    } /* END CONNECT PHASE */

    check = Curl_timeleft(data, NULL, TRUE);
    if(check <= 0) {
      failf(data, "Proxy CONNECT aborted due to timeout");
      return CURLE_RECV_ERROR;
    }

    if(!blocking) {
      if(!Curl_conn_data_pending(conn, sockindex))
        /* return so we'll be called again polling-style */
        return CURLE_OK;
      else {
        DEBUGF(infof(data,
               "Read response immediately from proxy CONNECT\n"));
      }
    }

    /* at this point, the tunnel_connecting phase is over. */

    { /* READING RESPONSE PHASE */
      size_t nread;   /* total size read */
      int perline; /* count bytes per line */
      int keepon=TRUE;
      ssize_t gotbytes;
      char *ptr;
      char *line_start;

      ptr = data->state.buffer;
      line_start = ptr;

      nread = 0;
      perline = 0;

      while(nread < BUFSIZE && keepon && !error) {
        int writetype;

        if(Curl_pgrsUpdate(conn))
          return CURLE_ABORTED_BY_CALLBACK;

        if(ptr >= &data->state.buffer[BUFSIZE]) {
          failf(data, "CONNECT response too large!");
          return CURLE_RECV_ERROR;
        }

        check = Curl_timeleft(data, NULL, TRUE);
        if(check <= 0) {
          failf(data, "Proxy CONNECT aborted due to timeout");
          error = SELECT_TIMEOUT; /* already too little time */
          break;
        }

        /* Read one byte at a time to avoid a race condition. Wait at most one
           second before looping to ensure continuous pgrsUpdates. */
        result = Curl_read(conn, tunnelsocket, ptr, 1, &gotbytes);
        if(result == CURLE_AGAIN) {
          if(SOCKET_READABLE(tunnelsocket, check<1000L?check:1000) == -1) {
            error = SELECT_ERROR;
            failf(data, "Proxy CONNECT aborted due to select/poll error");
            break;
          }
          continue;
        }
        else if(result) {
          keepon = FALSE;
          break;
        }
        else if(gotbytes <= 0) {
          if(data->set.proxyauth && data->state.authproxy.avail) {
            /* proxy auth was requested and there was proxy auth available,
               then deem this as "mere" proxy disconnect */
            conn->bits.proxy_connect_closed = TRUE;
            infof(data, "Proxy CONNECT connection closed\n");
          }
          else {
            error = SELECT_ERROR;
            failf(data, "Proxy CONNECT aborted");
          }
          keepon = FALSE;
          break;
        }

        /* We got a byte of data */
        nread++;

        if(keepon > TRUE) {
          /* This means we are currently ignoring a response-body */

          nread = 0; /* make next read start over in the read buffer */
          ptr = data->state.buffer;
          if(cl) {
            /* A Content-Length based body: simply count down the counter
               and make sure to break out of the loop when we're done! */
            cl--;
            if(cl <= 0) {
              keepon = FALSE;
              break;
            }
          }
          else {
            /* chunked-encoded body, so we need to do the chunked dance
               properly to know when the end of the body is reached */
            CHUNKcode r;
            ssize_t tookcareof = 0;

            /* now parse the chunked piece of data so that we can
               properly tell when the stream ends */
            r = Curl_httpchunk_read(conn, ptr, 1, &tookcareof);
            if(r == CHUNKE_STOP) {
              /* we're done reading chunks! */
              infof(data, "chunk reading DONE\n");
              keepon = FALSE;
              /* we did the full CONNECT treatment, go COMPLETE */
              conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
            }
          }
          continue;
        }

        perline++; /* amount of bytes in this line so far */

        /* if this is not the end of a header line then continue */
        if(*ptr != 0x0a) {
          ptr++;
          continue;
        }

        /* convert from the network encoding */
        result = Curl_convert_from_network(data, line_start, perline);
        /* Curl_convert_from_network calls failf if unsuccessful */
        if(result)
          return result;

        /* output debug if that is requested */
        if(data->set.verbose)
          Curl_debug(data, CURLINFO_HEADER_IN,
                     line_start, (size_t)perline, conn);

        /* send the header to the callback */
        writetype = CLIENTWRITE_HEADER;
        if(data->set.include_header)
          writetype |= CLIENTWRITE_BODY;

        result = Curl_client_write(conn, writetype, line_start, perline);

        data->info.header_size += (long)perline;
        data->req.headerbytecount += (long)perline;

        if(result)
          return result;

        /* Newlines are CRLF, so the CR is ignored as the line isn't
           really terminated until the LF comes. Treat a following CR
           as end-of-headers as well.*/

        if(('\r' == line_start[0]) ||
           ('\n' == line_start[0])) {
          /* end of response-headers from the proxy */
          nread = 0; /* make next read start over in the read
                        buffer */
          ptr = data->state.buffer;
          if((407 == k->httpcode) && !data->state.authproblem) {
            /* If we get a 407 response code with content length
               when we have no auth problem, we must ignore the
               whole response-body */
            keepon = 2;

            if(cl) {
              infof(data, "Ignore %" CURL_FORMAT_CURL_OFF_T
                    " bytes of response-body\n", cl);
            }
            else if(chunked_encoding) {
              CHUNKcode r;

              infof(data, "Ignore chunked response-body\n");

              /* We set ignorebody true here since the chunked
                 decoder function will acknowledge that. Pay
                 attention so that this is cleared again when this
                 function returns! */
              k->ignorebody = TRUE;

              if(line_start[1] == '\n') {
                /* this can only be a LF if the letter at index 0
                   was a CR */
                line_start++;
              }

              /* now parse the chunked piece of data so that we can
                 properly tell when the stream ends */
              r = Curl_httpchunk_read(conn, line_start + 1, 1, &gotbytes);
              if(r == CHUNKE_STOP) {
                /* we're done reading chunks! */
                infof(data, "chunk reading DONE\n");
                keepon = FALSE;
                /* we did the full CONNECT treatment, go to
                   COMPLETE */
                conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
              }
            }
            else {
              /* without content-length or chunked encoding, we
                 can't keep the connection alive since the close is
                 the end signal so we bail out at once instead */
              keepon = FALSE;
            }
          }
          else
            keepon = FALSE;
          /* we did the full CONNECT treatment, go to COMPLETE */
          conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
          continue;
        }

        line_start[perline] = 0; /* zero terminate the buffer */
        if((checkprefix("WWW-Authenticate:", line_start) &&
            (401 == k->httpcode)) ||
           (checkprefix("Proxy-authenticate:", line_start) &&
            (407 == k->httpcode))) {

          bool proxy = (k->httpcode == 407) ? TRUE : FALSE;
          char *auth = Curl_copy_header_value(line_start);
          if(!auth)
            return CURLE_OUT_OF_MEMORY;

          result = Curl_http_input_auth(conn, proxy, auth);

          free(auth);

          if(result)
            return result;
        }
        else if(checkprefix("Content-Length:", line_start)) {
          if(k->httpcode/100 == 2) {
            /* A server MUST NOT send any Transfer-Encoding or
               Content-Length header fields in a 2xx (Successful)
               response to CONNECT. (RFC 7231 section 4.3.6) */
            failf(data, "Content-Length: in %03d response",
                  k->httpcode);
            return CURLE_RECV_ERROR;
          }

          cl = curlx_strtoofft(line_start +
                               strlen("Content-Length:"), NULL, 10);
        }
        else if(Curl_compareheader(line_start, "Connection:", "close"))
          closeConnection = TRUE;
        else if(Curl_compareheader(line_start,
                                   "Transfer-Encoding:",
                                   "chunked")) {
          if(k->httpcode/100 == 2) {
            /* A server MUST NOT send any Transfer-Encoding or
               Content-Length header fields in a 2xx (Successful)
               response to CONNECT. (RFC 7231 section 4.3.6) */
            failf(data, "Transfer-Encoding: in %03d response", k->httpcode);
            return CURLE_RECV_ERROR;
          }
          infof(data, "CONNECT responded chunked\n");
          chunked_encoding = TRUE;
          /* init our chunky engine */
          Curl_httpchunk_init(conn);
        }
        else if(Curl_compareheader(line_start, "Proxy-Connection:", "close"))
          closeConnection = TRUE;
        else if(2 == sscanf(line_start, "HTTP/1.%d %d",
                            &subversion,
                            &k->httpcode)) {
          /* store the HTTP code from the proxy */
          data->info.httpproxycode = k->httpcode;
        }

        perline = 0; /* line starts over here */
        ptr = data->state.buffer;
        line_start = ptr;
      } /* while there's buffer left and loop is requested */

      if(Curl_pgrsUpdate(conn))
        return CURLE_ABORTED_BY_CALLBACK;

      if(error)
        return CURLE_RECV_ERROR;

      if(data->info.httpproxycode != 200) {
        /* Deal with the possibly already received authenticate
           headers. 'newurl' is set to a new URL if we must loop. */
        result = Curl_http_auth_act(conn);
        if(result)
          return result;

        if(conn->bits.close)
          /* the connection has been marked for closure, most likely in the
             Curl_http_auth_act() function and thus we can kill it at once
             below */
          closeConnection = TRUE;
      }

      if(closeConnection && data->req.newurl) {
        /* Connection closed by server. Don't use it anymore */
        Curl_closesocket(conn, conn->sock[sockindex]);
        conn->sock[sockindex] = CURL_SOCKET_BAD;
        break;
      }
    } /* END READING RESPONSE PHASE */

    /* If we are supposed to continue and request a new URL, which basically
     * means the HTTP authentication is still going on so if the tunnel
     * is complete we start over in INIT state */
    if(data->req.newurl &&
       (TUNNEL_COMPLETE == conn->tunnel_state[sockindex])) {
      conn->tunnel_state[sockindex] = TUNNEL_INIT;
      infof(data, "TUNNEL_STATE switched to: %d\n",
            conn->tunnel_state[sockindex]);
    }

  } while(data->req.newurl);

  if(200 != data->req.httpcode) {
    if(closeConnection && data->req.newurl) {
      conn->bits.proxy_connect_closed = TRUE;
      infof(data, "Connect me again please\n");
    }
    else {
      free(data->req.newurl);
      data->req.newurl = NULL;
      /* failure, close this connection to avoid re-use */
      streamclose(conn, "proxy CONNECT failure");
      Curl_closesocket(conn, conn->sock[sockindex]);
      conn->sock[sockindex] = CURL_SOCKET_BAD;
    }

    /* to back to init state */
    conn->tunnel_state[sockindex] = TUNNEL_INIT;

    if(conn->bits.proxy_connect_closed)
      /* this is not an error, just part of the connection negotiation */
      return CURLE_OK;
    else {
      failf(data, "Received HTTP code %d from proxy after CONNECT",
            data->req.httpcode);
      return CURLE_RECV_ERROR;
    }
  }

  conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;

  /* If a proxy-authorization header was used for the proxy, then we should
     make sure that it isn't accidentally used for the document request
     after we've connected. So let's free and clear it here. */
  Curl_safefree(conn->allocptr.proxyuserpwd);
  conn->allocptr.proxyuserpwd = NULL;

  data->state.authproxy.done = TRUE;

  infof(data, "Proxy replied OK to CONNECT request\n");
  data->req.ignorebody = FALSE; /* put it (back) to non-ignore state */
  conn->bits.rewindaftersend = FALSE; /* make sure this isn't set for the
                                         document request  */
  return CURLE_OK;
}